

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_ref(lua_State *L,int t)

{
  int iVar1;
  lua_Integer lVar2;
  size_t sVar3;
  int iVar4;
  
  iVar4 = -1;
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
  }
  else {
    iVar1 = lua_absindex(L,t);
    lua_rawgeti(L,iVar1,0);
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
    lua_settop(L,-2);
    iVar4 = (int)lVar2;
    if (iVar4 == 0) {
      sVar3 = lua_rawlen(L,iVar1);
      iVar4 = (int)sVar3 + 1;
    }
    else {
      lua_rawgeti(L,iVar1,(long)iVar4);
      lua_rawseti(L,iVar1,0);
    }
    lua_rawseti(L,iVar1,(long)iVar4);
  }
  return iVar4;
}

Assistant:

LUALIB_API int luaL_ref (lua_State *L, int t) {
  int ref;
  if (lua_isnil(L, -1)) {
    lua_pop(L, 1);  /* remove from stack */
    return LUA_REFNIL;  /* 'nil' has a unique fixed reference */
  }
  t = lua_absindex(L, t);
  lua_rawgeti(L, t, freelist);  /* get first free element */
  ref = (int)lua_tointeger(L, -1);  /* ref = t[freelist] */
  lua_pop(L, 1);  /* remove it from stack */
  if (ref != 0) {  /* any free element? */
    lua_rawgeti(L, t, ref);  /* remove it from list */
    lua_rawseti(L, t, freelist);  /* (t[freelist] = t[ref]) */
  }
  else  /* no free elements */
    ref = (int)lua_rawlen(L, t) + 1;  /* get a new reference */
  lua_rawseti(L, t, ref);
  return ref;
}